

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O2

void __thiscall jaegertracing::net::IPAddress::print(IPAddress *this,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  string addrStr;
  string sStack_38;
  
  poVar2 = std::operator<<(out,"{ family=");
  iVar1 = family(this);
  std::ostream::operator<<(poVar2,iVar1);
  host_abi_cxx11_(&sStack_38,this);
  if (sStack_38._M_string_length != 0) {
    poVar2 = std::operator<<(out,", addr=");
    std::operator<<(poVar2,(string *)&sStack_38);
  }
  poVar2 = std::operator<<(out,", port=");
  iVar1 = port(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2," }");
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void print(std::ostream& out) const
    {
        out << "{ family=" << family();
        const auto addrStr = host();
        if (!addrStr.empty()) {
            out << ", addr=" << addrStr;
        }
        out << ", port=" << port() << " }";
    }